

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

ON_wString * __thiscall ON_wString::Set(ON_wString *this,wchar_t *wsz,int numChars)

{
  wchar_t *__dest;
  ON_wStringHeader *pOVar1;
  wchar_t *pBuffer;
  int numChars_local;
  wchar_t *wsz_local;
  ON_wString *this_local;
  
  CopyArray(this);
  __dest = ReserveArray(this,(long)numChars);
  if (__dest != (wchar_t *)0x0) {
    memmove(__dest,wsz,(long)numChars << 2);
    this->m_s[numChars] = L'\0';
    pOVar1 = Header(this);
    pOVar1->string_length = numChars;
  }
  return this;
}

Assistant:

const ON_wString& ON_wString::Set(const wchar_t* wsz, int numChars)
{
  CopyArray();

  auto* pBuffer = ReserveArray(numChars);
  if (nullptr != pBuffer)
  {
    memmove(pBuffer, wsz, numChars * sizeof(wchar_t));
    m_s[numChars] = 0;
    Header()->string_length = numChars;
  }

  return *this;
}